

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitWithSpacedVars_Test::TestBody
          (PrinterTest_EmitWithSpacedVars_Test *this)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  bool bVar1;
  ZeroCopyOutputStream *output;
  char *message;
  Sub *local_4d0;
  AssertHelper local_498;
  Message local_490;
  string_view local_488;
  undefined1 local_478 [8];
  AssertionResult gtest_ar;
  basic_string_view<char,_std::char_traits<char>_> local_460;
  basic_string_view<char,_std::char_traits<char>_> local_448;
  undefined1 local_432;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3d1;
  string local_3d0;
  Sub *local_3b0;
  Sub local_3a8;
  Sub local_2f0;
  Sub local_238;
  iterator local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_170;
  undefined1 local_160 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer printer;
  PrinterTest_EmitWithSpacedVars_Test *this_local;
  
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer((Printer *)(v.storage_.callback_buffer_ + 8),output);
  local_432 = 1;
  local_3b0 = &local_3a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"is_final",&local_3d1);
  Printer::Sub::Sub<char_const(&)[6]>(&local_3a8,&local_3d0,(char (*) [6])0x1eae11b);
  local_3b0 = &local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"isnt_final",&local_409);
  Printer::Sub::Sub<char_const(&)[1]>
            (&local_2f0,&local_408,(char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  local_3b0 = &local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"class",&local_431);
  Printer::Sub::Sub<char_const(&)[4]>(&local_238,&local_430,(char (*) [4])0x1e8efa3);
  local_432 = 0;
  local_180 = &local_3a8;
  local_178 = 3;
  v_00._M_len = 3;
  v_00._M_array = local_180;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_170._M_local_buf,v_00);
  Printer::WithVars((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
                     *)local_160,(Printer *)(v.storage_.callback_buffer_ + 8),
                    (Span<const_google::protobuf::io::Printer::Sub>)local_170);
  local_4d0 = (Sub *)&local_180;
  do {
    local_4d0 = local_4d0 + -1;
    Printer::Sub::~Sub(local_4d0);
  } while (local_4d0 != &local_3a8);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_448,
             "\n      public $is_final $class $class$ {\n        // Stuff.\n      }\n    ");
  Printer::SourceLocation::current();
  Printer::Emit((Printer *)(v.storage_.callback_buffer_ + 8),local_448._M_len,local_448._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_460,
             "\n      public $isnt_final $class $class$ {\n        // Stuff.\n      }\n    ");
  Printer::SourceLocation::current();
  Printer::Emit((Printer *)(v.storage_.callback_buffer_ + 8),local_460._M_len,local_460._M_str);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_160);
  Printer::~Printer((Printer *)(v.storage_.callback_buffer_ + 8));
  local_488 = PrinterTest::written(&this->super_PrinterTest);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_char[73],_nullptr>
            ((EqHelper *)local_478,"written()",
             "\"public final class Foo {\\n\" \"  // Stuff.\\n\" \"}\\n\" \"public class Foo {\\n\" \"  // Stuff.\\n\" \"}\\n\""
             ,&local_488,
             (char (*) [73])
             "public final class Foo {\n  // Stuff.\n}\npublic class Foo {\n  // Stuff.\n}\n");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x2b8,message);
    testing::internal::AssertHelper::operator=(&local_498,&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  return;
}

Assistant:

TEST_F(PrinterTest, EmitWithSpacedVars) {
  {
    Printer printer(output());
    auto v = printer.WithVars({
        {"is_final", "final"},
        {"isnt_final", ""},
        {"class", "Foo"},
    });
    printer.Emit(R"java(
      public $is_final $class $class$ {
        // Stuff.
      }
    )java");
    printer.Emit(R"java(
      public $isnt_final $class $class$ {
        // Stuff.
      }
    )java");
  }

  EXPECT_EQ(written(),
            "public final class Foo {\n"
            "  // Stuff.\n"
            "}\n"
            "public class Foo {\n"
            "  // Stuff.\n"
            "}\n");
}